

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultRawMemoryAllocator.cpp
# Opt level: O0

void * __thiscall
Diligent::DefaultRawMemoryAllocator::Allocate
          (DefaultRawMemoryAllocator *this,size_t Size,Char *dbgDescription,char *dbgFileName,
          Int32 dbgLineNumber)

{
  Char *Message;
  void *pvVar1;
  undefined1 local_50 [8];
  string msg;
  Int32 dbgLineNumber_local;
  char *dbgFileName_local;
  Char *dbgDescription_local;
  size_t Size_local;
  DefaultRawMemoryAllocator *this_local;
  
  msg.field_2._12_4_ = dbgLineNumber;
  if (Size == 0) {
    FormatString<char[26],char[9]>
              ((string *)local_50,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcd22bc,
               (char (*) [9])dbgFileName);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/DefaultRawMemoryAllocator.cpp"
               ,0x51);
    std::__cxx11::string::~string((string *)local_50);
  }
  pvVar1 = malloc(Size);
  return pvVar1;
}

Assistant:

void* DefaultRawMemoryAllocator::Allocate(size_t Size, const Char* dbgDescription, const char* dbgFileName, const Int32 dbgLineNumber)
{
    VERIFY_EXPR(Size > 0);
#ifdef USE_CRT_MALLOC_DBG
    return _malloc_dbg(Size, _NORMAL_BLOCK, dbgFileName, dbgLineNumber);
#else
    return malloc(Size);
#endif
}